

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

void __thiscall
testing::internal::FunctionMocker<solitaire::colliders::interfaces::StockPileCollider_&()>::
PrintTriedExpectationsLocked
          (FunctionMocker<solitaire::colliders::interfaces::StockPileCollider_&()> *this,
          ArgumentTuple *args,ostream *why)

{
  pointer psVar1;
  pointer psVar2;
  TypedExpectation<solitaire::colliders::interfaces::StockPileCollider_&()> *this_00;
  ostream *poVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  psVar1 = (this->super_UntypedFunctionMockerBase).untyped_expectations_.
           super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (this->super_UntypedFunctionMockerBase).untyped_expectations_.
           super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)psVar1 - (long)psVar2;
  uVar7 = lVar6 >> 4;
  std::__ostream_insert<char,std::char_traits<char>>(why,"Google Mock tried the following ",0x20);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)why);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  pcVar5 = "expectations, but none matched";
  if (lVar6 == 0x10) {
    pcVar5 = "expectation, but it didn\'t match";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,pcVar5,(ulong)(lVar6 == 0x10) * 2 + 0x1e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":\n",2);
  if (psVar1 != psVar2) {
    lVar8 = 0;
    lVar6 = 0;
    do {
      this_00 = *(TypedExpectation<solitaire::colliders::interfaces::StockPileCollider_&()> **)
                 ((long)&(((this->super_UntypedFunctionMockerBase).untyped_expectations_.
                           super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>(why,"\n",1);
      ExpectationBase::DescribeLocationTo(&this_00->super_ExpectationBase,why);
      if (1 < uVar7) {
        std::__ostream_insert<char,std::char_traits<char>>(why,"tried expectation #",0x13);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)why);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      }
      pcVar5 = (this_00->super_ExpectationBase).source_text_._M_dataplus._M_p;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)why + (int)*(undefined8 *)(*(long *)why + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(why,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(why,"...\n",4);
      TypedExpectation<solitaire::colliders::interfaces::StockPileCollider_&()>::
      ExplainMatchResultTo(this_00,args,why);
      ExpectationBase::DescribeCallCountTo(&this_00->super_ExpectationBase,why);
      lVar6 = lVar6 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 + (uVar7 == 0) != lVar6);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const size_t count = untyped_expectations_.size();
    *why << "Google Mock tried the following " << count << " "
         << (count == 1 ? "expectation, but it didn't match" :
             "expectations, but none matched")
         << ":\n";
    for (size_t i = 0; i < count; i++) {
      TypedExpectation<F>* const expectation =
          static_cast<TypedExpectation<F>*>(untyped_expectations_[i].get());
      *why << "\n";
      expectation->DescribeLocationTo(why);
      if (count > 1) {
        *why << "tried expectation #" << i << ": ";
      }
      *why << expectation->source_text() << "...\n";
      expectation->ExplainMatchResultTo(args, why);
      expectation->DescribeCallCountTo(why);
    }
  }